

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O2

value_type_conflict4 __thiscall
lineage::NegativeLogProbabilityRatio<double>::operator()
          (NegativeLogProbabilityRatio<double> *this,value_type_conflict4 x)

{
  double dVar1;
  
  dVar1 = this->epsilon_;
  if ((this->epsilon_ <= x) && (dVar1 = x, this->oneMinusEpsilon_ < x)) {
    dVar1 = this->oneMinusEpsilon_;
  }
  dVar1 = log((1.0 - dVar1) / dVar1);
  return dVar1;
}

Assistant:

value_type operator()(value_type x) const
        {
            assert(.0 <= x && x <= 1.0);
            if(x < epsilon_) {
                x = epsilon_;
            }
            else if(x > oneMinusEpsilon_) {
                x = oneMinusEpsilon_;
            }
            return std::log( (1.0 - x) / x );
        }